

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

int Gia_ManFactorSop(Gia_Man_t *p,Vec_Int_t *vCiObjIds,Vec_Str_t *vSop,int fHash)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Gia_Man_t *p_00;
  Gia_Obj_t *pFanout;
  uint uVar9;
  Gia_Obj_t *pGVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  
  p_00 = Abc_SopSynthesizeOne(vSop->pArray,1);
  iVar13 = p_00->nRegs;
  pVVar3 = p_00->vCis;
  uVar6 = pVVar3->nSize;
  uVar5 = uVar6 - iVar13;
  if (uVar5 != vCiObjIds->nSize) {
    __assert_fail("Gia_ManPiNum(pMan) == Vec_IntSize(vCiObjIds)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                  ,0x42b,"int Gia_ManFactorSop(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *, int)");
  }
  pGVar10 = p_00->pObjs;
  pGVar10->Value = 0;
  if ((int)uVar5 < 1) {
    iVar8 = p_00->nObjs;
    if (iVar8 < 1) goto LAB_005bd8f5;
  }
  else {
    uVar14 = 0;
    uVar17 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar17 = uVar14;
    }
    do {
      if (uVar17 == uVar14) goto LAB_005bd968;
      iVar13 = pVVar3->pArray[uVar14];
      if (((long)iVar13 < 0) || (iVar8 = p_00->nObjs, iVar8 <= iVar13)) goto LAB_005bd987;
      if (uVar5 == uVar14) goto LAB_005bd968;
      if (vCiObjIds->pArray[uVar14] < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      pGVar10[iVar13].Value = vCiObjIds->pArray[uVar14] * 2;
      uVar14 = uVar14 + 1;
    } while (uVar5 != uVar14);
  }
  pGVar10 = p_00->pObjs;
  if (pGVar10 != (Gia_Obj_t *)0x0) {
    lVar15 = 0;
    do {
      uVar17 = *(ulong *)pGVar10;
      if ((uVar17 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar17) {
        uVar6 = pGVar10[-(uVar17 & 0x1fffffff)].Value;
        uVar5 = (uint)(uVar17 >> 0x20);
        if (fHash == 0) {
          if (((int)uVar6 < 0) ||
             (uVar16 = pGVar10[-(ulong)(uVar5 & 0x1fffffff)].Value, (int)uVar16 < 0))
          goto LAB_005bd9e4;
          pFanout = Gia_ManAppendObj(p);
          uVar9 = uVar6 >> 1;
          uVar1 = p->nObjs;
          if ((int)uVar1 <= (int)uVar9) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          uVar7 = uVar16 >> 1;
          if (uVar1 <= uVar7) {
            __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          if ((uVar9 == uVar7) && (p->fGiaSimple == 0)) {
            __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          uVar6 = uVar6 ^ (uint)(uVar17 >> 0x1d) & 1;
          uVar16 = uVar16 ^ uVar5 >> 0x1d & 1;
          pGVar4 = p->pObjs;
          iVar13 = (int)pFanout;
          if (uVar6 < uVar16) {
            if (pGVar4 + uVar1 <= pFanout || pFanout < pGVar4) goto LAB_005bd9c5;
            uVar17 = *(ulong *)pFanout;
            uVar14 = (ulong)((uVar6 & 1) << 0x1d |
                            ((uint)(iVar13 - (int)pGVar4) >> 2) * -0x55555555 - uVar9 & 0x1fffffff);
            *(ulong *)pFanout = uVar14 | uVar17 & 0xffffffffc0000000;
            pGVar4 = p->pObjs;
            if ((pFanout < pGVar4) || (pGVar4 + p->nObjs <= pFanout)) goto LAB_005bd9c5;
            uVar17 = (ulong)(uVar16 & 1) << 0x3d |
                     (ulong)(((uint)(iVar13 - (int)pGVar4) >> 2) * -0x55555555 - uVar7 & 0x1fffffff)
                     << 0x20 | uVar14 | uVar17 & 0xc0000000c0000000;
          }
          else {
            if (pGVar4 + uVar1 <= pFanout || pFanout < pGVar4) goto LAB_005bd9c5;
            uVar14 = (ulong)(((uint)(iVar13 - (int)pGVar4) >> 2) * -0x55555555 - uVar9 & 0x1fffffff)
                     << 0x20;
            uVar17 = *(ulong *)pFanout;
            uVar11 = (ulong)(uVar6 & 1) << 0x3d;
            *(ulong *)pFanout = uVar11 | uVar17 & 0xc0000000ffffffff | uVar14;
            pGVar4 = p->pObjs;
            if ((pFanout < pGVar4) || (pGVar4 + p->nObjs <= pFanout)) goto LAB_005bd9c5;
            uVar17 = (ulong)((uVar16 & 1) << 0x1d) | uVar11 | uVar17 & 0xc0000000c0000000 | uVar14 |
                     (ulong)(((uint)(iVar13 - (int)pGVar4) >> 2) * -0x55555555 - uVar7 & 0x1fffffff)
            ;
          }
          *(ulong *)pFanout = uVar17;
          if (p->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(p,pFanout + -(uVar17 & 0x1fffffff),pFanout);
            Gia_ObjAddFanout(p,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout
                            );
          }
          if (p->fSweeper != 0) {
            uVar14 = *(ulong *)pFanout & 0x1fffffff;
            uVar17 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
            uVar11 = 0x4000000000000000;
            if (((uint)*(ulong *)(pFanout + -uVar14) >> 0x1e & 1) == 0) {
              uVar11 = 0x40000000;
            }
            *(ulong *)(pFanout + -uVar14) = uVar11 | *(ulong *)(pFanout + -uVar14);
            uVar11 = *(ulong *)(pFanout + -uVar17);
            uVar12 = 0x4000000000000000;
            if (((uint)uVar11 >> 0x1e & 1) == 0) {
              uVar12 = 0x40000000;
            }
            *(ulong *)(pFanout + -uVar17) = uVar12 | uVar11;
            uVar17 = *(ulong *)pFanout;
            *(ulong *)pFanout =
                 uVar17 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar17 >> 0x3d) ^ (uint)(uVar11 >> 0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pFanout + -uVar14) >> 0x3f) ^
                        (uint)(uVar17 >> 0x1d) & 7)) << 0x3f;
          }
          if (p->fBuiltInSim != 0) {
            uVar17 = *(ulong *)pFanout;
            *(ulong *)pFanout =
                 uVar17 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar17 >> 0x3d) ^
                         (uint)((ulong)*(undefined8 *)(pFanout + -(uVar17 >> 0x20 & 0x1fffffff)) >>
                               0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar17 & 0x1fffffff)) >> 0x3f) ^
                        (uint)(uVar17 >> 0x1d) & 7)) << 0x3f;
            pGVar4 = p->pObjs;
            if ((pFanout < pGVar4) || (pGVar4 + p->nObjs <= pFanout)) goto LAB_005bd9c5;
            Gia_ManBuiltInSimPerform
                      (p,(int)((ulong)((long)pFanout - (long)pGVar4) >> 2) * -0x55555555);
          }
          if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
            Gia_ManQuantSetSuppAnd(p,pFanout);
          }
          pGVar4 = p->pObjs;
          if ((pFanout < pGVar4) || (pGVar4 + p->nObjs <= pFanout)) {
LAB_005bd9c5:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar6 = (int)((ulong)((long)pFanout - (long)pGVar4) >> 2) * 0x55555556;
        }
        else {
          if (((int)uVar6 < 0) || ((int)pGVar10[-(ulong)(uVar5 & 0x1fffffff)].Value < 0))
          goto LAB_005bd9e4;
          uVar6 = Gia_ManHashAnd(p,uVar6 ^ (uint)(uVar17 >> 0x1d) & 1,
                                 pGVar10[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
        }
        pGVar10->Value = uVar6;
      }
      lVar15 = lVar15 + 1;
      iVar8 = p_00->nObjs;
    } while ((lVar15 < iVar8) && (pGVar10 = p_00->pObjs + lVar15, p_00->pObjs != (Gia_Obj_t *)0x0));
  }
  iVar13 = p_00->nRegs;
LAB_005bd8f5:
  iVar2 = p_00->vCos->nSize;
  if (iVar2 <= iVar13) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar2 < 1) {
LAB_005bd968:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar13 = *p_00->vCos->pArray;
  if (((long)iVar13 < 0) || (iVar8 <= iVar13)) {
LAB_005bd987:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar5 = (uint)*(undefined8 *)(p_00->pObjs + iVar13);
  uVar6 = (p_00->pObjs + iVar13)[-(ulong)(uVar5 & 0x1fffffff)].Value;
  if (-1 < (int)uVar6) {
    Gia_ManStop(p_00);
    return uVar5 >> 0x1d & 1 ^ uVar6;
  }
LAB_005bd9e4:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Gia_ManFactorSop( Gia_Man_t * p, Vec_Int_t * vCiObjIds, Vec_Str_t * vSop, int fHash )
{
    extern Gia_Man_t * Abc_SopSynthesizeOne( char * pSop, int fClp );
    Gia_Man_t * pMan = Abc_SopSynthesizeOne( Vec_StrArray(vSop), 1 );
    Gia_Obj_t * pObj; int i, Result;
    assert( Gia_ManPiNum(pMan) == Vec_IntSize(vCiObjIds) );
    Gia_ManConst0(pMan)->Value = 0;
    Gia_ManForEachPi( pMan, pObj, i )
        pObj->Value = Abc_Var2Lit( Vec_IntEntry(vCiObjIds, i), 0 );
    Gia_ManForEachAnd( pMan, pObj, i )
        if ( fHash )
            pObj->Value = Gia_ManHashAnd( p, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( p, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManPo(pMan, 0);
    Result = Gia_ObjFanin0Copy(pObj);
    Gia_ManStop( pMan );
    return Result;
}